

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::AST_Node_Trace_const&,void>
          (Boxed_Value *this,AST_Node_Trace *t,bool t_return_value)

{
  pointer pcVar1;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  File_Position local_60;
  File_Position FStack_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_> local_40;
  
  local_88._0_4_ = t->identifier;
  pcVar1 = (t->text)._M_dataplus._M_p;
  local_80._M_p = (pointer)&local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (t->text)._M_string_length);
  local_60 = (t->location).start;
  FStack_58 = (t->location).end;
  local_50 = (t->location).filename.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_48._M_pi =
       (t->location).filename.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::vector
            (&local_40,&t->children);
  Object_Data::get<chaiscript::AST_Node_Trace>
            ((Object_Data *)this,(AST_Node_Trace *)local_88,t_return_value);
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::~vector
            (&local_40);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }